

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentBG.cpp
# Opt level: O0

void __thiscall
AgentBG::AgentBG(AgentBG *this,PlanningUnitDecPOMDPDiscrete *pu,Index id,
                QAV<PerseusBGNSPlanner> *QBG)

{
  void *pvVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  undefined8 in_RCX;
  PlanningUnitDecPOMDPDiscrete *in_RSI;
  undefined8 *in_RDI;
  undefined1 in_stack_00000077;
  undefined4 in_stack_00000080;
  undefined8 in_stack_ffffffffffffff70;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffff78;
  JointBeliefSparse *in_stack_ffffffffffffff80;
  Interface_ProblemToPolicyDiscretePure *pu_00;
  JointPolicyPureVector *this_00;
  
  AgentDelayedSharedObservations::AgentDelayedSharedObservations
            ((AgentDelayedSharedObservations *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (Index)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  *in_RDI = &PTR__AgentBG_00d0da20;
  in_RDI[3] = 0;
  in_RDI[4] = in_RCX;
  in_RDI[5] = 0;
  JointBeliefSparse::JointBeliefSparse(in_stack_ffffffffffffff80);
  pu_00 = (Interface_ProblemToPolicyDiscretePure *)(in_RDI + 0x13);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8fa466);
  this_00 = (JointPolicyPureVector *)(in_RDI + 0x16);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8fa47c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8fa492);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8fa4a8);
  pvVar1 = operator_new(0xe8);
  (*(in_RSI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])();
  pDVar2 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(in_RSI);
  (**(code **)(*(long *)(&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8)) + 0x58))
            (&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8));
  pDVar2 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(in_RSI);
  (**(code **)(*(long *)(&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8)) + 0xb8))
            (&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8));
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            ((BayesianGameIdenticalPayoff *)this,(size_t)pu,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)CONCAT44(id,in_stack_00000080)
             ,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)QBG,(bool)in_stack_00000077);
  in_RDI[0x11] = pvVar1;
  pvVar1 = operator_new(0x98);
  JointPolicyPureVector::JointPolicyPureVector(this_00,pu_00);
  in_RDI[0x12] = pvVar1;
  return;
}

Assistant:

AgentBG::AgentBG(const PlanningUnitDecPOMDPDiscrete *pu, Index id,
                 QAV<PerseusBGNSPlanner> *QBG) :
    AgentDelayedSharedObservations(pu,id),
    _m_QBGstationary(0),
    _m_QBGnonStationary(QBG),
    _m_t(0)
{
    _m_bgip=new BayesianGameIdenticalPayoff(pu->GetNrAgents(),
                                            pu->GetDPOMDPD()->GetNrActions(), 
                                            pu->GetDPOMDPD()->
                                            GetNrObservations());
    _m_jpol=new JointPolicyPureVector(_m_bgip);
#if DEBUG_AgentBG
    cout << GetIndex() << " " <<_m_jpol->SoftPrint() << endl;
#endif
}